

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

void __thiscall duckdb::StringValueScanner::ProcessOverBufferValue(StringValueScanner *this)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  shared_ptr<duckdb::CSVBufferHandle,_true> *psVar1;
  StringValueResult *result;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_01;
  idx_t *piVar2;
  byte bVar3;
  CSVState CVar4;
  char cVar5;
  char quote;
  data_ptr_t pdVar6;
  CSVStates *pCVar7;
  size_type sVar8;
  idx_t iVar9;
  bool bVar10;
  CSVState CVar11;
  CSVBufferHandle *pCVar12;
  CSVStateMachine *pCVar13;
  reference pvVar14;
  ulong uVar15;
  ulong uVar16;
  InternalException *this_02;
  char *pcVar17;
  long lVar18;
  uint uVar19;
  idx_t iVar20;
  char *__src;
  char *pcVar21;
  optional_ptr<duckdb::FileBuffer,_true> *this_03;
  long lVar22;
  long lVar23;
  idx_t iVar24;
  string over_buffer_string;
  undefined1 local_88 [12];
  undefined4 uStack_7c;
  string local_78;
  idx_t local_58;
  char *local_50;
  idx_t local_48;
  char local_40 [16];
  
  iVar24 = (this->result).super_ScannerResult.last_position.buffer_pos;
  psVar1 = &this->previous_buffer_handle;
  pCVar12 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
  if (iVar24 != pCVar12->actual_size) {
    *(undefined2 *)(this->super_BaseScanner).states.states = 0xb0b;
  }
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = '\0';
  pCVar12 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
  this_03 = &(pCVar12->handle).node;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_03);
  result = &this->result;
  pdVar6 = this_03->ptr->buffer;
  (this->result).super_ScannerResult.quoted = false;
  this_00 = &(this->super_BaseScanner).state_machine;
  iVar20 = 0;
  for (iVar24 = (this->result).super_ScannerResult.last_position.buffer_pos;
      pCVar12 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1),
      iVar24 < pCVar12->actual_size; iVar24 = iVar24 + 1) {
    pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    bVar3 = pdVar6[iVar24];
    CVar4 = (this->super_BaseScanner).states.states[1];
    (this->super_BaseScanner).states.states[0] = CVar4;
    CVar11 = pCVar13->transition_array->state_machine[bVar3][CVar4];
    (this->super_BaseScanner).states.states[1] = CVar11;
    if (1 < (byte)(CVar11 - RECORD_SEPARATOR)) {
      if (CVar11 == DELIMITER) break;
      if ((this->result).super_ScannerResult.comment == false) {
        ::std::__cxx11::string::push_back((char)&local_50);
        CVar4 = (this->super_BaseScanner).states.states[0];
      }
      if (CVar4 == UNQUOTED) {
        pCVar7 = (this->result).super_ScannerResult.states;
        if (((pCVar7->states[0] == UNQUOTED) && (pCVar7->states[1] == UNQUOTED)) &&
           ((((this->result).super_ScannerResult.state_machine)->dialect_options).
            state_machine_options.escape.value != '\0')) {
          (this->result).super_ScannerResult.escaped = true;
        }
        (result->super_ScannerResult).quoted = true;
        bVar3 = 1;
      }
      else {
        if (CVar4 == QUOTED) {
          if ((result->super_ScannerResult).quoted == false) {
            (this->result).super_ScannerResult.quoted_position = iVar20;
          }
          (this->result).super_ScannerResult.quoted = true;
          (this->result).super_ScannerResult.unquoted = true;
        }
        bVar3 = 0;
      }
      CVar11 = (this->super_BaseScanner).states.states[1];
      switch(CVar11) {
      case QUOTED:
        if (!(bool)(CVar4 != MAYBE_QUOTED & (bVar3 ^ 1))) goto switchD_017df9ea_caseD_9;
        break;
      case UNQUOTED:
        if (CVar4 == MAYBE_QUOTED) goto switchD_017df9ea_caseD_9;
        break;
      case ESCAPE:
      case UNQUOTED_ESCAPE:
      case ESCAPED_RETURN:
switchD_017df9ea_caseD_9:
        if ((((this->result).super_ScannerResult.state_machine)->dialect_options).
            state_machine_options.escape.value != '\0') {
          (this->result).super_ScannerResult.escaped = true;
        }
        if (CVar11 == INVALID) goto switchD_017df9ea_caseD_a;
        if (CVar11 == COMMENT) goto switchD_017df9ea_caseD_e;
        break;
      case INVALID:
switchD_017df9ea_caseD_a:
        StringValueResult::InvalidState(result);
        break;
      case COMMENT:
switchD_017df9ea_caseD_e:
        (this->result).super_ScannerResult.comment = true;
      }
      iVar20 = iVar20 + 1;
    }
  }
  if ((local_48 == 0) &&
     (pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
     (pCVar13->dialect_options).state_machine_options.new_line.value == CARRY_ON)) {
    if ((this->super_BaseScanner).iterator.is_set == true) {
      this_01 = &(this->super_BaseScanner).cur_buffer_handle;
      iVar24 = (this->super_BaseScanner).iterator.pos.buffer_pos;
      while (pCVar12 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01),
            iVar24 < pCVar12->actual_size) {
        iVar24 = (this->super_BaseScanner).iterator.pos.buffer_pos;
        cVar5 = (this->super_BaseScanner).buffer_handle_ptr[iVar24];
        if (cVar5 == '\n') {
          pCVar12 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01);
          if (iVar24 + 1 == pCVar12->actual_size) goto LAB_017e0111;
        }
        else {
          if (cVar5 != '\r') break;
          uVar16 = (this->result).super_ScannerResult.last_position.buffer_pos;
          pCVar12 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
          if (uVar16 <= pCVar12->actual_size) {
            pCVar12 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
            StringValueResult::AddValue(result,pCVar12->actual_size);
            if ((this->result).super_ScannerResult.comment == true) {
              StringValueResult::UnsetComment
                        (result,(this->super_BaseScanner).iterator.pos.buffer_pos);
            }
            else {
              pCVar12 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
              StringValueResult::AddRow(result,pCVar12->actual_size);
            }
            pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
            while( true ) {
              iVar24 = (this->super_BaseScanner).iterator.pos.buffer_pos;
              pcVar21 = (this->super_BaseScanner).buffer_handle_ptr;
              uVar16 = iVar24 + 1;
              (this->super_BaseScanner).iterator.pos.buffer_pos = uVar16;
              bVar3 = pcVar21[iVar24];
              CVar11 = (this->super_BaseScanner).states.states[1];
              (this->super_BaseScanner).states.states[0] = CVar11;
              (this->super_BaseScanner).states.states[1] =
                   pCVar13->transition_array->state_machine[bVar3][CVar11];
              pCVar12 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01);
              local_78._4_8_ =
                   (char *)CONCAT44((undefined4)local_78._M_string_length,
                                    local_78._M_dataplus._M_p._4_4_);
              if ((pCVar12->actual_size <= uVar16) ||
                 ((cVar5 = (this->super_BaseScanner).buffer_handle_ptr
                           [(this->super_BaseScanner).iterator.pos.buffer_pos], cVar5 != '\r' &&
                  (local_78._4_8_ =
                        (char *)CONCAT44((undefined4)local_78._M_string_length,
                                         local_78._M_dataplus._M_p._4_4_), cVar5 != '\n')))) break;
              pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
            }
            goto LAB_017e0111;
          }
        }
        pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        iVar24 = (this->super_BaseScanner).iterator.pos.buffer_pos;
        bVar3 = (this->super_BaseScanner).buffer_handle_ptr[iVar24];
        CVar11 = (this->super_BaseScanner).states.states[1];
        (this->super_BaseScanner).states.states[0] = CVar11;
        (this->super_BaseScanner).states.states[1] =
             pCVar13->transition_array->state_machine[bVar3][CVar11];
        iVar24 = iVar24 + 1;
        (this->super_BaseScanner).iterator.pos.buffer_pos = iVar24;
      }
    }
    else {
      iVar24 = (this->super_BaseScanner).iterator.pos.buffer_pos;
      if ((this->super_BaseScanner).buffer_handle_ptr[iVar24] == '\n') {
        (this->super_BaseScanner).iterator.pos.buffer_pos = iVar24 + 1;
      }
    }
  }
  psVar1 = &(this->super_BaseScanner).cur_buffer_handle;
  iVar24 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  while (pCVar12 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1),
        iVar24 < pCVar12->actual_size) {
    pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    bVar3 = (this->super_BaseScanner).buffer_handle_ptr
            [(this->super_BaseScanner).iterator.pos.buffer_pos];
    CVar11 = (this->super_BaseScanner).states.states[1];
    (this->super_BaseScanner).states.states[0] = CVar11;
    CVar4 = pCVar13->transition_array->state_machine[bVar3][CVar11];
    (this->super_BaseScanner).states.states[1] = CVar4;
    if ((byte)(CVar4 - RECORD_SEPARATOR) < 2) {
      if ((CVar11 != NOT_SET) && (CVar11 != RECORD_SEPARATOR)) {
        if (0xfd < (byte)(CVar11 - QUOTED)) goto LAB_017dfbca;
        break;
      }
      pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      if ((pCVar13->dialect_options).num_cols == 1) break;
    }
    else {
      if (CVar4 == DELIMITER) break;
LAB_017dfbca:
      if ((CVar4 != COMMENT) && ((this->result).super_ScannerResult.comment == false)) {
        ::std::__cxx11::string::push_back((char)&local_50);
        CVar11 = (this->super_BaseScanner).states.states[0];
      }
      if (CVar11 == QUOTED) {
        if ((result->super_ScannerResult).quoted == false) {
          (this->result).super_ScannerResult.quoted_position = iVar20;
        }
        (this->result).super_ScannerResult.quoted = true;
        (this->result).super_ScannerResult.unquoted = true;
      }
      CVar4 = (this->super_BaseScanner).states.states[1];
      switch(CVar4) {
      case QUOTED:
        if ((CVar11 == MAYBE_QUOTED) || (CVar11 == UNQUOTED)) goto switchD_017dfc18_caseD_9;
        break;
      case UNQUOTED:
        if (CVar11 == MAYBE_QUOTED) goto switchD_017dfc18_caseD_9;
        break;
      case ESCAPE:
      case UNQUOTED_ESCAPE:
      case ESCAPED_RETURN:
switchD_017dfc18_caseD_9:
        if ((((this->result).super_ScannerResult.state_machine)->dialect_options).
            state_machine_options.escape.value != '\0') {
          (this->result).super_ScannerResult.escaped = true;
        }
        if (CVar4 == INVALID) goto switchD_017dfc18_caseD_a;
        break;
      case INVALID:
switchD_017dfc18_caseD_a:
        StringValueResult::InvalidState(result);
        break;
      case COMMENT:
        (this->result).super_ScannerResult.comment = true;
      }
      iVar20 = iVar20 + 1;
    }
    iVar24 = (this->super_BaseScanner).iterator.pos.buffer_pos + 1;
    (this->super_BaseScanner).iterator.pos.buffer_pos = iVar24;
  }
  iVar24 = local_48;
  pcVar21 = local_50;
  if ((((this->result).projecting_columns == true) &&
      (uVar16 = (this->result).cur_col_id,
      (this->result).projected_columns.super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
      super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl[uVar16] == false)) &&
     (uVar16 != (this->result).number_of_columns)) {
    (this->result).cur_col_id = uVar16 + 1;
    local_78._4_8_ =
         (char *)CONCAT44((undefined4)local_78._M_string_length,local_78._M_dataplus._M_p._4_4_);
    if (((byte)((this->super_BaseScanner).states.states[1] - RECORD_SEPARATOR) < 2) &&
       ((CVar11 = (this->super_BaseScanner).states.states[0], CVar11 == RECORD_SEPARATOR ||
        (local_78._4_8_ =
              (char *)CONCAT44((undefined4)local_78._M_string_length,local_78._M_dataplus._M_p._4_4_
                              ), CVar11 == NOT_SET)))) {
      pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      if ((pCVar13->dialect_options).num_cols == 1) {
        StringValueResult::EmptyLine(result,(this->super_BaseScanner).iterator.pos.buffer_pos);
      }
    }
  }
  else {
    if (((result->super_ScannerResult).quoted == true) &&
       ((this->result).super_ScannerResult.comment == false)) {
      uVar16 = (this->result).super_ScannerResult.quoted_position;
      lVar22 = ~uVar16 + local_48;
      if (lVar22 != 0) {
        __src = local_50 + uVar16;
        pcVar17 = local_50 + (local_48 - 1);
        lVar18 = lVar22;
        do {
          lVar23 = lVar22;
          if (((this->result).ignore_empty_values == false) || (lVar23 = lVar18, *pcVar17 != ' ')) {
            uVar19 = (uint)lVar23;
            if (0xc < uVar19) {
              local_78._M_dataplus._M_p._0_4_ = *(undefined4 *)__src;
              goto LAB_017dfe7d;
            }
            local_78._M_string_length._0_4_ = 0;
            local_78._M_dataplus._M_p._0_4_ = 0;
            local_78._M_dataplus._M_p._4_4_ = 0;
            if (uVar19 != 0) {
              switchD_015de399::default(&local_78,__src,(ulong)(uVar19 & 0xf));
              __src = (char *)CONCAT44((undefined4)local_78._M_string_length,
                                       local_78._M_dataplus._M_p._4_4_);
              goto LAB_017dfe7d;
            }
            break;
          }
          pcVar17 = pcVar17 + -1;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      local_78._M_dataplus._M_p._0_4_ = 0;
      __src = (char *)0x0;
      uVar19 = 0;
LAB_017dfe7d:
      local_78._M_string_length._0_4_ = (undefined4)((ulong)__src >> 0x20);
      local_78._M_dataplus._M_p._4_4_ = SUB84(__src,0);
      local_88._8_4_ = local_78._M_dataplus._M_p._4_4_;
      local_88[4] = local_78._M_dataplus._M_p._0_1_;
      local_88[5] = local_78._M_dataplus._M_p._1_1_;
      local_88[6] = local_78._M_dataplus._M_p._2_1_;
      local_88[7] = local_78._M_dataplus._M_p._3_1_;
      local_88._0_4_ = uVar19;
      uStack_7c = (undefined4)local_78._M_string_length;
      local_78._4_8_ = __src;
      if ((this->result).super_ScannerResult.escaped == true) {
        bVar10 = StringValueResult::HandleTooManyColumnsError(result,pcVar21,iVar24);
        iVar24 = local_48;
        if (!bVar10) {
          pcVar21 = local_50 + (this->result).super_ScannerResult.quoted_position;
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          local_58 = CONCAT71(local_58._1_7_,
                              (pCVar13->dialect_options).state_machine_options.escape.value);
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          cVar5 = (pCVar13->dialect_options).state_machine_options.quote.value;
          bVar10 = (((this->result).super_ScannerResult.state_machine)->dialect_options).
                   state_machine_options.strict_mode.value;
          pvVar14 = vector<duckdb::Vector,_true>::operator[]
                              (&(this->result).parse_chunk.data,(this->result).chunk_col_id);
          _local_88 = (anon_struct_16_3_d7536bce_for_pointer)
                      RemoveEscape(pcVar21,iVar24 - 2,(char)local_58,cVar5,bVar10,pvVar14);
        }
      }
    }
    else {
      uVar19 = (uint)local_48;
      if (uVar19 < 0xd) {
        local_78._M_string_length._0_4_ = 0;
        local_78._M_dataplus._M_p._0_4_ = 0;
        local_78._M_dataplus._M_p._4_4_ = 0;
        if (uVar19 != 0) {
          switchD_015de399::default(&local_78,local_50,(ulong)(uVar19 & 0xf));
        }
      }
      else {
        local_78._M_dataplus._M_p._0_4_ = *(undefined4 *)local_50;
        local_78._M_dataplus._M_p._4_4_ = SUB84(local_50,0);
        local_78._M_string_length._0_4_ = (undefined4)((ulong)local_50 >> 0x20);
      }
      local_88._8_4_ = local_78._M_dataplus._M_p._4_4_;
      local_88[4] = local_78._M_dataplus._M_p._0_1_;
      local_88[5] = local_78._M_dataplus._M_p._1_1_;
      local_88[6] = local_78._M_dataplus._M_p._2_1_;
      local_88[7] = local_78._M_dataplus._M_p._3_1_;
      local_88._0_4_ = uVar19;
      uStack_7c = (undefined4)local_78._M_string_length;
      local_78._4_8_ =
           (char *)CONCAT44((undefined4)local_78._M_string_length,local_78._M_dataplus._M_p._4_4_);
      if ((this->result).super_ScannerResult.escaped == true) {
        bVar10 = StringValueResult::HandleTooManyColumnsError(result,pcVar21,iVar24);
        pcVar21 = local_50;
        local_78._4_8_ =
             (char *)CONCAT44((undefined4)local_78._M_string_length,local_78._M_dataplus._M_p._4_4_)
        ;
        if (!bVar10) {
          local_58 = local_48;
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          cVar5 = (pCVar13->dialect_options).state_machine_options.escape.value;
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          quote = (pCVar13->dialect_options).state_machine_options.quote.value;
          bVar10 = (((this->result).super_ScannerResult.state_machine)->dialect_options).
                   state_machine_options.strict_mode.value;
          pvVar14 = vector<duckdb::Vector,_true>::operator[]
                              (&(this->result).parse_chunk.data,(this->result).chunk_col_id);
          _local_88 = (anon_struct_16_3_d7536bce_for_pointer)
                      RemoveEscape(pcVar21,local_58,cVar5,quote,bVar10,pvVar14);
        }
      }
    }
    CVar11 = (this->super_BaseScanner).states.states[1];
    if ((byte)(CVar11 - RECORD_SEPARATOR) < 2) {
      CVar4 = (this->super_BaseScanner).states.states[0];
      if ((CVar4 == NOT_SET) || (CVar4 == RECORD_SEPARATOR)) {
        pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        if ((pCVar13->dialect_options).num_cols == 1) {
          StringValueResult::EmptyLine(result,(this->super_BaseScanner).iterator.pos.buffer_pos);
          goto LAB_017dffc9;
        }
        CVar11 = (this->super_BaseScanner).states.states[1];
        goto LAB_017dff6a;
      }
    }
    else {
LAB_017dff6a:
      if (CVar11 == NOT_SET) goto LAB_017dffc9;
    }
    if (((this->result).super_ScannerResult.comment & local_88._0_4_ == 0) == 0) {
      uVar16 = (ulong)(uint)local_88._0_4_;
      if (((CVar11 == DELIMITER) &&
          (sVar8 = (((this->result).super_ScannerResult.state_machine)->dialect_options).
                   state_machine_options.delimiter.value._M_string_length, sVar8 != 0)) &&
         (uVar15 = sVar8 - 1, bVar10 = uVar16 < uVar15, uVar16 = uVar16 - uVar15, bVar10)) {
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,
                   "Value size is lower than the number of extra delimiter bytes in the ProcessOverBufferValue()"
                   ,"");
        InternalException::InternalException(this_02,&local_78);
        __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((uint)local_88._0_4_ < 0xd) {
        pcVar21 = local_88 + 4;
      }
      else {
        pcVar21 = stack0xffffffffffffff80;
      }
      StringValueResult::AddValueToVector(result,pcVar21,uVar16,true);
    }
  }
LAB_017dffc9:
  if (((byte)((this->super_BaseScanner).states.states[0] - QUOTED) < 0xfe) &&
     ((byte)((this->super_BaseScanner).states.states[1] - RECORD_SEPARATOR) < 2)) {
    if ((this->result).super_ScannerResult.comment == true) {
      iVar24 = (this->super_BaseScanner).iterator.pos.buffer_pos;
      uVar16 = (this->result).super_ScannerResult.last_position.buffer_pos;
      uVar15 = (this->result).position_before_comment;
      if (uVar16 < uVar15) {
        do {
          if ((this->result).buffer_ptr[uVar16] != ' ') goto LAB_017e002f;
          uVar16 = uVar16 + 1;
        } while (uVar15 != uVar16);
      }
      else if ((this->result).cur_col_id != 0) {
LAB_017e002f:
        StringValueResult::AddRow(result,uVar15);
      }
      if ((this->result).number_of_rows == 0) {
        (this->result).first_line_is_comment = true;
      }
      (this->result).super_ScannerResult.comment = false;
      (this->result).super_ScannerResult.last_position.buffer_pos =
           ((((this->result).super_ScannerResult.state_machine)->dialect_options).
            state_machine_options.new_line.value == CARRY_ON) + iVar24 + 1;
      (this->result).cur_col_id = 0;
      (this->result).chunk_col_id = 0;
    }
    else {
      StringValueResult::AddRowInternal(result);
    }
    piVar2 = &(this->super_BaseScanner).lines_read;
    *piVar2 = *piVar2 + 1;
  }
  uVar16 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  pCVar12 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
  if (pCVar12->actual_size <= uVar16) {
    pCVar12 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
    if (pCVar12->is_last_buffer == true) {
      (this->result).added_last_line = true;
    }
  }
  if ((this->super_BaseScanner).states.states[1] == CARRIAGE_RETURN) {
    pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    if ((pCVar13->dialect_options).state_machine_options.new_line.value == CARRY_ON) {
      iVar24 = (this->super_BaseScanner).iterator.pos.buffer_idx;
      iVar20 = (this->super_BaseScanner).iterator.pos.buffer_pos;
      (this->super_BaseScanner).iterator.pos.buffer_pos = iVar20 + 1;
      iVar20 = iVar20 + 2;
      goto LAB_017e00e7;
    }
  }
  iVar24 = (this->super_BaseScanner).iterator.pos.buffer_idx;
  iVar20 = (this->super_BaseScanner).iterator.pos.buffer_pos + 1;
  (this->super_BaseScanner).iterator.pos.buffer_pos = iVar20;
LAB_017e00e7:
  iVar9 = (this->result).buffer_size;
  (this->result).super_ScannerResult.last_position.buffer_pos = iVar20;
  (this->result).super_ScannerResult.last_position.buffer_size = iVar9;
  (this->result).super_ScannerResult.last_position.buffer_idx = iVar24;
  (this->result).super_ScannerResult.quoted = false;
  (this->result).super_ScannerResult.escaped = false;
LAB_017e0111:
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void StringValueScanner::ProcessOverBufferValue() {
	// Process first string
	if (result.last_position.buffer_pos != previous_buffer_handle->actual_size) {
		states.Initialize();
	}

	string over_buffer_string;
	auto previous_buffer = previous_buffer_handle->Ptr();
	idx_t j = 0;
	result.quoted = false;
	for (idx_t i = result.last_position.buffer_pos; i < previous_buffer_handle->actual_size; i++) {
		state_machine->Transition(states, previous_buffer[i]);
		if (states.EmptyLine() || states.IsCurrentNewRow()) {
			continue;
		}
		if (states.NewRow() || states.NewValue()) {
			break;
		} else if (!result.comment) {
			over_buffer_string += previous_buffer[i];
		}
		if (states.IsQuoted()) {
			result.SetQuoted(result, j);
		}
		if (states.IsUnquoted()) {
			result.SetUnquoted(result);
		}
		if (states.IsEscaped() && result.state_machine.dialect_options.state_machine_options.escape != '\0') {
			result.escaped = true;
		}
		if (states.IsComment()) {
			result.comment = true;
		}
		if (states.IsInvalid()) {
			result.InvalidState(result);
		}
		j++;
	}
	if (over_buffer_string.empty() &&
	    state_machine->dialect_options.state_machine_options.new_line == NewLineIdentifier::CARRY_ON) {
		if (!iterator.IsBoundarySet()) {
			if (buffer_handle_ptr[iterator.pos.buffer_pos] == '\n') {
				iterator.pos.buffer_pos++;
			}
		} else {
			while (iterator.pos.buffer_pos < cur_buffer_handle->actual_size &&
			       (buffer_handle_ptr[iterator.pos.buffer_pos] == '\n' ||
			        buffer_handle_ptr[iterator.pos.buffer_pos] == '\r')) {
				if (buffer_handle_ptr[iterator.pos.buffer_pos] == '\r') {
					if (result.last_position.buffer_pos <= previous_buffer_handle->actual_size) {
						// we add the value
						result.AddValue(result, previous_buffer_handle->actual_size);
						if (result.IsCommentSet(result)) {
							result.UnsetComment(result, iterator.pos.buffer_pos);
						} else {
							result.AddRow(result, previous_buffer_handle->actual_size);
						}
						state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos++]);
						while (iterator.pos.buffer_pos < cur_buffer_handle->actual_size &&
						       (buffer_handle_ptr[iterator.pos.buffer_pos] == '\r' ||
						        buffer_handle_ptr[iterator.pos.buffer_pos] == '\n')) {
							state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos++]);
						}
						return;
					}
				} else {
					if (iterator.pos.buffer_pos + 1 == cur_buffer_handle->actual_size) {
						return;
					}
				}
				state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos]);
				iterator.pos.buffer_pos++;
			}
		}
	}
	// second buffer
	for (; iterator.pos.buffer_pos < cur_buffer_handle->actual_size; iterator.pos.buffer_pos++) {
		state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos]);
		if (states.EmptyLine()) {
			if (state_machine->dialect_options.num_cols == 1) {
				break;
			}
			continue;
		}
		if (states.NewRow() || states.NewValue()) {
			break;
		} else if (!result.comment && !states.IsComment()) {
			over_buffer_string += buffer_handle_ptr[iterator.pos.buffer_pos];
		}
		if (states.IsQuoted()) {
			result.SetQuoted(result, j);
		}
		if (states.IsComment()) {
			result.comment = true;
		}
		if (states.IsEscaped() && result.state_machine.dialect_options.state_machine_options.escape != '\0') {
			result.escaped = true;
		}
		if (states.IsInvalid()) {
			result.InvalidState(result);
		}
		j++;
	}
	bool skip_value = false;
	if (result.projecting_columns) {
		if (!result.projected_columns[result.cur_col_id] && result.cur_col_id != result.number_of_columns) {
			result.cur_col_id++;
			skip_value = true;
		}
	}
	if (!skip_value) {
		string_t value;
		if (result.quoted && !result.comment) {
			idx_t length = over_buffer_string.size() - 1 - result.quoted_position;
			while (length > 0 && result.ignore_empty_values &&
			       over_buffer_string.c_str()[result.quoted_position + length] == ' ') {
				length--;
			}
			value = string_t(over_buffer_string.c_str() + result.quoted_position, UnsafeNumericCast<uint32_t>(length));
			if (result.escaped) {
				if (!result.HandleTooManyColumnsError(over_buffer_string.c_str(), over_buffer_string.size())) {
					const auto str_ptr = over_buffer_string.c_str() + result.quoted_position;
					value =
					    RemoveEscape(str_ptr, over_buffer_string.size() - 2,
					                 state_machine->dialect_options.state_machine_options.escape.GetValue(),
					                 state_machine->dialect_options.state_machine_options.quote.GetValue(),
					                 result.state_machine.dialect_options.state_machine_options.strict_mode.GetValue(),
					                 result.parse_chunk.data[result.chunk_col_id]);
				}
			}
		} else {
			value = string_t(over_buffer_string.c_str(), UnsafeNumericCast<uint32_t>(over_buffer_string.size()));
			if (result.escaped) {
				if (!result.HandleTooManyColumnsError(over_buffer_string.c_str(), over_buffer_string.size())) {
					value =
					    RemoveEscape(over_buffer_string.c_str(), over_buffer_string.size(),
					                 state_machine->dialect_options.state_machine_options.escape.GetValue(),
					                 state_machine->dialect_options.state_machine_options.quote.GetValue(),
					                 result.state_machine.dialect_options.state_machine_options.strict_mode.GetValue(),
					                 result.parse_chunk.data[result.chunk_col_id]);
				}
			}
		}
		if (states.EmptyLine() && state_machine->dialect_options.num_cols == 1) {
			result.EmptyLine(result, iterator.pos.buffer_pos);
		} else if (!states.IsNotSet() && (!result.comment || !value.Empty())) {
			idx_t value_size = value.GetSize();
			if (states.IsDelimiter() &&
			    !result.state_machine.dialect_options.state_machine_options.delimiter.GetValue().empty()) {
				idx_t extra_delimiter_bytes =
				    result.state_machine.dialect_options.state_machine_options.delimiter.GetValue().size() - 1;
				if (extra_delimiter_bytes > value_size) {
					throw InternalException(
					    "Value size is lower than the number of extra delimiter bytes in the ProcessOverBufferValue()");
				}
				value_size -= extra_delimiter_bytes;
			}
			result.AddValueToVector(value.GetData(), value_size, true);
		}
	} else {
		if (states.EmptyLine() && state_machine->dialect_options.num_cols == 1) {
			result.EmptyLine(result, iterator.pos.buffer_pos);
		}
	}

	if (states.NewRow() && !states.IsNotSet()) {
		if (result.IsCommentSet(result)) {
			result.UnsetComment(result, iterator.pos.buffer_pos);
		} else {
			result.AddRowInternal();
		}
		lines_read++;
	}

	if (iterator.pos.buffer_pos >= cur_buffer_handle->actual_size && cur_buffer_handle->is_last_buffer) {
		result.added_last_line = true;
	}
	if (states.IsCarriageReturn() &&
	    state_machine->dialect_options.state_machine_options.new_line == NewLineIdentifier::CARRY_ON) {
		result.last_position = {iterator.pos.buffer_idx, ++iterator.pos.buffer_pos + 1, result.buffer_size};
	} else {
		result.last_position = {iterator.pos.buffer_idx, ++iterator.pos.buffer_pos, result.buffer_size};
	}
	// Be sure to reset the quoted and escaped variables
	result.quoted = false;
	result.escaped = false;
}